

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O3

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int *piVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  
  iVar1 = bottom_blob->dims;
  if (iVar1 == 3) {
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar11 = bottom_blob->c;
    Mat::create(top_blob,iVar1,iVar2,uVar11,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep != 0) {
      if (0 < (int)uVar11) {
        uVar12 = iVar2 * iVar1;
        uVar14 = 0;
        do {
          if (0 < (int)uVar12) {
            sVar4 = bottom_blob->elemsize;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pvVar9 = top_blob->data;
            sVar7 = bottom_blob->cstep;
            pvVar10 = bottom_blob->data;
            uVar13 = 0;
            do {
              fVar15 = roundf(this->scale *
                              *(float *)((long)pvVar10 + uVar13 * 4 + sVar4 * sVar7 * uVar14));
              if (fVar15 <= -128.0) {
                fVar15 = -128.0;
              }
              if (127.0 <= fVar15) {
                fVar15 = 127.0;
              }
              *(char *)((long)pvVar9 + uVar13 + sVar5 * sVar6 * uVar14) = (char)(int)fVar15;
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar11);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if (iVar1 != 2) {
    if (iVar1 != 1) {
      return 0;
    }
    uVar11 = bottom_blob->w;
    pAVar3 = opt->blob_allocator;
    if ((((top_blob->dims == 1) && (top_blob->w == uVar11)) && (top_blob->elemsize == 1)) &&
       (top_blob->allocator == pAVar3)) {
      pvVar9 = top_blob->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
    }
    else {
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 1;
      top_blob->allocator = pAVar3;
      top_blob->dims = 1;
      top_blob->w = uVar11;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = (long)(int)uVar11;
      if (uVar11 == 0) {
        return -100;
      }
      uVar14 = (long)(int)uVar11 + 3U & 0xfffffffffffffffc;
      if (pAVar3 == (Allocator *)0x0) {
        pvVar10 = malloc(uVar14 + 0x1c);
        pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 + -8) = pvVar10;
      }
      else {
        pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar14 + 4);
      }
      top_blob->data = pvVar9;
      top_blob->refcount = (int *)(uVar14 + (long)pvVar9);
      *(undefined4 *)((long)pvVar9 + uVar14) = 1;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (0 < (int)uVar11) {
      pvVar10 = bottom_blob->data;
      uVar14 = 0;
      do {
        fVar15 = roundf(this->scale * *(float *)((long)pvVar10 + uVar14 * 4));
        if (fVar15 <= -128.0) {
          fVar15 = -128.0;
        }
        if (127.0 <= fVar15) {
          fVar15 = 127.0;
        }
        *(char *)((long)pvVar9 + uVar14) = (char)(int)fVar15;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      return 0;
    }
    return 0;
  }
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  Mat::create(top_blob,iVar1,iVar2,1,opt->blob_allocator);
  pvVar9 = top_blob->data;
  if (pvVar9 == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep != 0) {
    uVar11 = iVar2 * iVar1;
    if (0 < (int)uVar11) {
      pvVar10 = bottom_blob->data;
      uVar14 = 0;
      do {
        fVar15 = roundf(this->scale * *(float *)((long)pvVar10 + uVar14 * 4));
        if (fVar15 <= -128.0) {
          fVar15 = -128.0;
        }
        if (127.0 <= fVar15) {
          fVar15 = 127.0;
        }
        *(char *)((long)pvVar9 + uVar14) = (char)(int)fVar15;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      return 0;
    }
    return 0;
  }
  return -100;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}